

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto.hpp
# Opt level: O2

Key __thiscall Keyset::computeKey(Keyset *this,uint32_t seed)

{
  pointer pcVar1;
  uint uVar2;
  uint32_t x;
  uint32_t x_00;
  uint32_t x_01;
  uint32_t uVar3;
  ulong uVar4;
  ulong uVar5;
  Key KVar6;
  
  pcVar1 = (this->m_magic)._M_dataplus._M_p;
  uVar2 = std::
          accumulate<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,unsigned_int,crc32_0x04C11DB7<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,unsigned_int)::_lambda(unsigned_int&,char_const&)_1_>
                    (pcVar1,pcVar1 + (this->m_magic)._M_string_length,0);
  x = invXorShift(~(seed ^ uVar2),(this->m_key)._M_elems[0]);
  x_00 = invXorShift(x,(this->m_key)._M_elems[1]);
  x_01 = invXorShift(x_00,(this->m_key)._M_elems[2]);
  uVar3 = invXorShift(x_01,(this->m_key)._M_elems[3]);
  uVar5 = CONCAT44(uVar3,x_01) & 0x1fffffff007fffff;
  uVar4 = CONCAT44(x_00,x) & 0x7ffff0001ffff;
  KVar6._M_elems[2] = (int)uVar5;
  KVar6._M_elems[3] = (int)(uVar5 >> 0x20);
  KVar6._M_elems[0] = (int)uVar4;
  KVar6._M_elems[1] = (int)(uVar4 >> 0x20);
  return (Key)KVar6._M_elems;
}

Assistant:

const Key computeKey(uint32_t seed) const
	{
		const auto c0 = (~crc32_0x04C11DB7(m_magic.begin(), m_magic.end(), 0)) ^ seed;

		const auto c1 = invXorShift(c0, m_key[0]);
		const auto c2 = invXorShift(c1, m_key[1]);
		const auto c3 = invXorShift(c2, m_key[2]);
		const auto c4 = invXorShift(c3, m_key[3]);

		return Key({{
			c1 & ((1 << 17) - 1),
			c2 & ((1 << 19) - 1),
			c3 & ((1 << 23) - 1),
			c4 & ((1 << 29) - 1),
		}});
	}